

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::FindLessThan
          (SkipList<unsigned_long,_leveldb::Comparator> *this,unsigned_long *key)

{
  Node *pNVar1;
  Node *pNVar2;
  int n;
  Node *this_00;
  
  pNVar1 = this->head_;
  n = (this->max_height_).super___atomic_base<int>._M_i + -1;
  this_00 = pNVar1;
  while ((this_00 == pNVar1 || (this_00->key < *key))) {
    pNVar2 = Node::Next(this_00,n);
    if ((pNVar2 == (Node *)0x0) || (*key <= pNVar2->key)) {
      if (n == 0) {
        return this_00;
      }
      n = n + -1;
      pNVar2 = this_00;
    }
    pNVar1 = this->head_;
    this_00 = pNVar2;
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<unsigned long, leveldb::Comparator>::FindLessThan(const Key &) const [Key = unsigned long, Comparator = leveldb::Comparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}